

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_type_lookupSelectorRecursively
          (sysbvm_context_t *context,sysbvm_tuple_t type,sysbvm_tuple_t selector)

{
  sysbvm_chunkedAllocatorChunk_t *dictionary;
  char cVar1;
  _Bool _Var2;
  sysbvm_tuple_t in_RAX;
  sysbvm_tuple_t sVar3;
  sysbvm_tuple_t extraout_RDX;
  sysbvm_context_t *context_00;
  sysbvm_tuple_t found;
  sysbvm_tuple_t local_18;
  
  if ((((ulong)context & 0xf) == 0 && context != (sysbvm_context_t *)0x0) &&
     (cVar1 = (char)*(undefined4 *)&(context->heap).lastMallocObject, -1 < cVar1)) {
    dictionary = (context->heap).codeAllocator.firstChunk;
    local_18 = in_RAX;
    if (dictionary != (sysbvm_chunkedAllocatorChunk_t *)0x0) {
      local_18 = 0;
      _Var2 = sysbvm_methodDictionary_find((sysbvm_tuple_t)dictionary,type,&local_18);
      if (_Var2) {
        return local_18;
      }
      cVar1 = (char)*(undefined4 *)&(context->heap).lastMallocObject;
      selector = extraout_RDX;
    }
    if (cVar1 < '\0') {
      context_00 = (sysbvm_context_t *)0x0;
    }
    else {
      context_00 = *(sysbvm_context_t **)&(context->heap).gcWhiteColor;
    }
    sVar3 = sysbvm_type_lookupSelectorRecursively(context_00,type,selector);
  }
  else {
    sVar3 = 0;
  }
  return sVar3;
}

Assistant:

static sysbvm_tuple_t sysbvm_type_lookupSelectorRecursively(sysbvm_context_t *context, sysbvm_tuple_t type, sysbvm_tuple_t selector)
{
    if(!sysbvm_tuple_isNonNullPointer(type)) return SYSBVM_NULL_TUPLE;
    if(sysbvm_tuple_isDummyValue(type)) return SYSBVM_NULL_TUPLE;
    sysbvm_tuple_t methodDictionary = sysbvm_type_getMethodDictionary(type);
    if(methodDictionary)
    {
        sysbvm_tuple_t found = SYSBVM_NULL_TUPLE;
        if(sysbvm_methodDictionary_find(methodDictionary, selector, &found))
            return found;
    }

    return sysbvm_type_lookupSelectorRecursively(context, sysbvm_type_getSupertype(type), selector);
}